

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socksd.c
# Opt level: O1

void loghex(uchar *buffer,ssize_t len)

{
  long lVar1;
  ulong uVar2;
  char *optr;
  size_t maxlength;
  char *buffer_00;
  char data [1200];
  char acStack_4e8 [1208];
  
  if (0 < len) {
    buffer_00 = acStack_4e8;
    uVar2 = 600;
    if (len - 1U < 600) {
      uVar2 = len - 1U;
    }
    maxlength = 0x4b0;
    do {
      curl_msnprintf(buffer_00,maxlength,"%02x",(ulong)*buffer);
      buffer_00 = buffer_00 + 2;
      lVar1 = maxlength + (uVar2 & 0xffffffff) * 2;
      maxlength = maxlength - 2;
      buffer = buffer + 1;
    } while (lVar1 != 0x4b0);
    if (0 < len) {
      logmsg("\'%s\'",acStack_4e8);
    }
  }
  return;
}

Assistant:

static void loghex(unsigned char *buffer, ssize_t len)
{
  char data[1200];
  ssize_t i;
  unsigned char *ptr = buffer;
  char *optr = data;
  ssize_t width = 0;
  int left = sizeof(data);

  for(i = 0; i<len && (left >= 0); i++) {
    msnprintf(optr, left, "%02x", ptr[i]);
    width += 2;
    optr += 2;
    left -= 2;
  }
  if(width)
    logmsg("'%s'", data);
}